

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DestroyDB(leveldb *this,string *dbname,Options *options)

{
  Env *pEVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  Status result;
  Status del;
  FileType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FileLock *lock;
  string lockname;
  uint64_t number;
  long *local_f0;
  char *local_e8;
  FileType local_dc;
  long *local_d8;
  long local_d0;
  long local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  leveldb *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  undefined8 local_60;
  string local_58;
  uint64_t local_38;
  
  pEVar1 = options->env;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*pEVar1->_vptr_Env[7])(&local_f0,pEVar1,dbname);
  if (local_f0 == (long *)0x0) {
    LockFileName(&local_58,dbname);
    (*pEVar1->_vptr_Env[0xd])(&local_d8,pEVar1,&local_58,&local_60);
    plVar4 = local_f0;
    local_f0 = local_d8;
    local_d8 = plVar4;
    if (plVar4 != (long *)0x0) {
      operator_delete__(plVar4);
    }
    if (local_f0 == (long *)0x0) {
      local_80 = this;
      if (local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          bVar3 = ParseFileName((string *)
                                ((long)&((local_b8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7),&local_38,&local_dc);
          if (bVar3 && local_dc != kDBLockFile) {
            local_a0[0] = local_90;
            pcVar2 = (dbname->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_a0,pcVar2,pcVar2 + dbname->_M_string_length);
            std::__cxx11::string::append((char *)local_a0);
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_a0,
                                        *(ulong *)((long)&((local_b8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar7));
            plVar5 = plVar4 + 2;
            if ((long *)*plVar4 == plVar5) {
              local_c8 = *plVar5;
              uStack_c0 = (undefined4)plVar4[3];
              uStack_bc = *(undefined4 *)((long)plVar4 + 0x1c);
              local_d8 = &local_c8;
            }
            else {
              local_c8 = *plVar5;
              local_d8 = (long *)*plVar4;
            }
            local_d0 = plVar4[1];
            *plVar4 = (long)plVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            (*pEVar1->_vptr_Env[8])(&local_e8,pEVar1,&local_d8);
            if (local_d8 != &local_c8) {
              operator_delete(local_d8);
            }
            if (local_a0[0] != local_90) {
              operator_delete(local_a0[0]);
            }
            if ((local_f0 == (long *)0x0) && (local_e8 != (char *)0x0)) {
              if (local_e8 == (char *)0x0) {
                local_f0 = (long *)0x0;
              }
              else {
                local_f0 = (long *)Status::CopyState(local_e8);
              }
            }
            if (local_e8 != (char *)0x0) {
              operator_delete__(local_e8);
            }
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x20;
        } while (uVar6 < (ulong)((long)local_b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      (*pEVar1->_vptr_Env[0xe])(&local_68,pEVar1,local_60);
      if (local_68 != (void *)0x0) {
        operator_delete__(local_68);
      }
      (*pEVar1->_vptr_Env[8])(&local_70,pEVar1,&local_58);
      if (local_70 != (void *)0x0) {
        operator_delete__(local_70);
      }
      (*pEVar1->_vptr_Env[10])(&local_78,pEVar1,dbname);
      this = local_80;
      if (local_78 != (void *)0x0) {
        operator_delete__(local_78);
      }
    }
    *(long **)this = local_f0;
    local_f0 = (long *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  else {
    *(undefined8 *)this = 0;
  }
  if (local_f0 != (long *)0x0) {
    operator_delete__(local_f0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return (Status)(char *)this;
}

Assistant:

Status DestroyDB(const std::string& dbname, const Options& options) {
  Env* env = options.env;
  std::vector<std::string> filenames;
  Status result = env->GetChildren(dbname, &filenames);
  if (!result.ok()) {
    // Ignore error in case directory does not exist
    return Status::OK();
  }

  FileLock* lock;
  const std::string lockname = LockFileName(dbname);
  result = env->LockFile(lockname, &lock);
  if (result.ok()) {
    uint64_t number;
    FileType type;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) &&
          type != kDBLockFile) {  // Lock file will be deleted at end
        Status del = env->DeleteFile(dbname + "/" + filenames[i]);
        if (result.ok() && !del.ok()) {
          result = del;
        }
      }
    }
    env->UnlockFile(lock);  // Ignore error since state is already gone
    env->DeleteFile(lockname);
    env->DeleteDir(dbname);  // Ignore error in case dir contains other files
  }
  return result;
}